

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO::
GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO
          (GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  pointer *ppTVar1;
  iterator __position;
  TextureInfo texInfo;
  TextureInfo local_20;
  
  GeometryShaderLayeredRenderingBoundaryCondition::GeometryShaderLayeredRenderingBoundaryCondition
            (&this->super_GeometryShaderLayeredRenderingBoundaryCondition,context,extParams,name,
             description);
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_021568f8;
  local_20.m_depth = 4;
  local_20.m_draw_buffer = 0x8ce0;
  local_20.m_id = 0;
  local_20.m_texture_target = 0x806f;
  __position._M_current =
       (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
       super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
    ::_M_realloc_insert<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo_const&>
              ((vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
                *)&(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info,
               __position,&local_20);
  }
  else {
    (__position._M_current)->m_depth = 4;
    (__position._M_current)->m_draw_buffer = 0x8ce0;
    (__position._M_current)->m_id = 0;
    (__position._M_current)->m_texture_target = 0x806f;
    ppTVar1 = &(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_draw_mode = 0;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_n_points = 1;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_is_fbo_layered = false;
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO::
	GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO(Context& context, const ExtParameters& extParams,
																const char* name, const char* description)
	: GeometryShaderLayeredRenderingBoundaryCondition(context, extParams, name, description)
{
	TextureInfo texInfo;

	texInfo.m_depth			 = 4;
	texInfo.m_draw_buffer	= GL_COLOR_ATTACHMENT0;
	texInfo.m_id			 = 0;
	texInfo.m_texture_target = GL_TEXTURE_3D;

	m_textures_info.push_back(texInfo);

	m_draw_mode		 = GL_POINTS;
	m_n_points		 = 1;
	m_is_fbo_layered = false;
}